

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void __thiscall kratos::Const::set_width(Const *this,uint32_t target_width)

{
  int64_t value;
  initializer_list<const_kratos::IRNode_*> __l;
  ConstantLegal CVar1;
  bool *pbVar2;
  VarException *this_00;
  remove_reference_t<unsigned_int_&> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  allocator<const_kratos::IRNode_*> local_109;
  Const *local_108;
  Const **local_100;
  size_type local_f8;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_f0;
  string local_c8;
  undefined1 local_a4 [8];
  uint32_t target_width_local;
  Const *this_local;
  undefined8 local_90;
  basic_string_view<char> local_88;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_long,_unsigned_int>
  local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_long,_unsigned_int>
  *local_58;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_long,_unsigned_int>
  *vargs;
  int64_t *local_48;
  char *local_40;
  string *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_long,_unsigned_int>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_long,_unsigned_int>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_long,_unsigned_int>
  *local_10;
  
  value = this->value_;
  local_a4._0_4_ = target_width;
  unique0x10000194 = this;
  pbVar2 = Var::is_signed(&this->super_Var);
  CVar1 = is_legal(value,target_width,(bool)(*pbVar2 & 1));
  if (CVar1 != Legal) {
    this_00 = (VarException *)__cxa_allocate_exception(0x10);
    local_48 = &this->value_;
    local_38 = &local_c8;
    local_40 = "Unable to set const {0} to width {1}";
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_long,_unsigned_int>
             *)local_a4;
    fmt::v7::make_args_checked<long&,unsigned_int&,char[37],char>
              (&local_78,(v7 *)"Unable to set const {0} to width {1}",(char (*) [37])local_48,
               (remove_reference_t<long_&> *)vargs,in_R8);
    local_58 = &local_78;
    local_88 = fmt::v7::to_string_view<char,_0>(local_40);
    local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)&this_local;
    local_30 = local_58;
    local_20 = local_58;
    local_10 = local_58;
    local_18 = local_28;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_28,0x23,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_58);
    format_str.size_ = (size_t)this_local;
    format_str.data_ = (char *)local_88.size_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = local_90;
    fmt::v7::detail::vformat_abi_cxx11_(&local_c8,(detail *)local_88.data_,format_str,args);
    local_100 = &local_108;
    local_f8 = 1;
    local_108 = this;
    std::allocator<const_kratos::IRNode_*>::allocator(&local_109);
    __l._M_len = local_f8;
    __l._M_array = (iterator)local_100;
    std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
              (&local_f0,__l,&local_109);
    VarException::VarException(this_00,&local_c8,&local_f0);
    __cxa_throw(this_00,&VarException::typeinfo,VarException::~VarException);
  }
  (this->super_Var).var_width_ = local_a4._0_4_;
  return;
}

Assistant:

void Const::set_width(uint32_t target_width) {
    if (Const::is_legal(value_, target_width, is_signed()) != Const::ConstantLegal::Legal) {
        throw VarException(::format("Unable to set const {0} to width {1}", value_, target_width),
                           {this});
    }
    var_width_ = target_width;
}